

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

QFlags<QtMocConstants::EnumFlags> * __thiscall
QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_>::operator[]
          (QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_> *this,QByteArray *key)

{
  QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>
  *pQVar1;
  iterator iVar2;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>,_bool>
  pVar3;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>_>
  local_48;
  pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>_*>
        )(this->d).d.ptr;
  if ((local_48.d.ptr ==
       (QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>
        *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(((QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>
           *)local_48.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1)) {
    local_48.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>_*>
          )(QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>
            *)0x0;
  }
  else {
    LOCK();
    (((QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>
       *)local_48.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>
                        *)local_48.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  detach(this);
  iVar2 = std::
          _Rb_tree<QByteArray,_std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>,_std::_Select1st<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>
          ::find(&(((this->d).d.ptr)->m)._M_t,key);
  pQVar1 = (this->d).d.ptr;
  if ((_Rb_tree_header *)iVar2._M_node == &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header) {
    local_40.first.d.d = (key->d).d;
    local_40.first.d.ptr = (key->d).ptr;
    local_40.first.d.size = (key->d).size;
    if (local_40.first.d.d != (Data *)0x0) {
      LOCK();
      ((local_40.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_40.second.super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
    super_QFlagsStorage<QtMocConstants::EnumFlags>.i =
         (QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>)
         (QFlagsStorage<QtMocConstants::EnumFlags>)0x0;
    pVar3 = std::
            _Rb_tree<QByteArray,std::pair<QByteArray_const,QFlags<QtMocConstants::EnumFlags>>,std::_Select1st<std::pair<QByteArray_const,QFlags<QtMocConstants::EnumFlags>>>,std::less<QByteArray>,std::allocator<std::pair<QByteArray_const,QFlags<QtMocConstants::EnumFlags>>>>
            ::_M_insert_unique<std::pair<QByteArray_const,QFlags<QtMocConstants::EnumFlags>>>
                      ((_Rb_tree<QByteArray,std::pair<QByteArray_const,QFlags<QtMocConstants::EnumFlags>>,std::_Select1st<std::pair<QByteArray_const,QFlags<QtMocConstants::EnumFlags>>>,std::less<QByteArray>,std::allocator<std::pair<QByteArray_const,QFlags<QtMocConstants::EnumFlags>>>>
                        *)&pQVar1->m,&local_40);
    iVar2._M_node = (_Base_ptr)pVar3.first._M_node;
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_40);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QFlags<QtMocConstants::EnumFlags> *)&iVar2._M_node[1]._M_right;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }